

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O1

void EntityRelationTask::er_allow_skip_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  void *pvVar1;
  example *ex;
  v_array<unsigned_long> *pvVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ptag t;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  
  pvVar1 = sch->task_data;
  lVar3 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          (1 - (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  auVar15._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar15._0_8_ = lVar3;
  auVar15._12_4_ = 0x45300000;
  dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  uVar4 = (ulong)(dVar14 + -1.0);
  *(undefined1 *)((long)pvVar1 + 0x11) = 1;
  uVar8 = 0;
  bVar12 = false;
  uVar9 = 0;
  uVar11 = 0;
  do {
    uVar7 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pvVar2 = (v_array<unsigned_long> *)((ulong)uVar8 % (uVar7 & 0xffffffff));
    uVar6 = uVar11;
    uVar10 = uVar9;
    bVar13 = bVar12;
    if (uVar11 != uVar7) {
      if (predictions->_begin[(long)pvVar2] == 0) {
        if (bVar12) {
          *(undefined1 *)((long)pvVar1 + 0x11) = 0;
        }
        ex = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)pvVar2];
        if (pvVar2 < (v_array<unsigned_long> *)
                     (((long)((dVar14 + -1.0) - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4
                      ) >> 1)) {
          sVar5 = predict_entity(sch,ex,pvVar2,(ptag)pvVar2,false);
        }
        else {
          sVar5 = predict_relation(sch,ex,predictions,(ptag)pvVar2,false);
        }
        if ((int)sVar5 != 0xb) {
          predictions->_begin[(long)pvVar2] = sVar5;
          uVar6 = uVar11 + 1;
        }
        if (bVar12) {
          *(undefined1 *)((long)pvVar1 + 0x11) = 1;
          bVar12 = false;
        }
      }
      bVar13 = bVar12;
      if (uVar6 == uVar9) {
        bVar13 = true;
      }
      uVar10 = uVar6;
      if ((v_array<unsigned_long> *)
          (((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3) + -1) != pvVar2) {
        uVar10 = uVar9;
        bVar13 = bVar12;
      }
    }
    bVar12 = bVar13;
    uVar8 = uVar8 + 1;
    bVar13 = uVar11 != uVar7;
    uVar9 = uVar10;
    uVar11 = uVar6;
  } while (bVar13);
  return;
}

Assistant:

void er_allow_skip_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;

  bool must_predict = false;
  size_t n_predicts = 0;
  size_t p_n_predicts = 0;
  my_task_data->allow_skip = true;

  // loop until all the entity and relation types are predicted
  for (ptag t = 0;; t++)
  {
    ptag i = t % (uint32_t)ec.size();
    if (n_predicts == ec.size())
      break;

    if (predictions[i] == 0)
    {
      if (must_predict)
      {
        my_task_data->allow_skip = false;
      }
      size_t prediction = 0;
      if (i < n_ent)  // do entity recognition
      {
        prediction = predict_entity(sch, ec[i], predictions, i);
      }
      else  // do relation recognition
      {
        prediction = predict_relation(sch, ec[i], predictions, i);
      }

      if (prediction != LABEL_SKIP)
      {
        predictions[i] = prediction;
        n_predicts++;
      }

      if (must_predict)
      {
        my_task_data->allow_skip = true;
        must_predict = false;
      }
    }

    if (i == ec.size() - 1)
    {
      if (n_predicts == p_n_predicts)
      {
        must_predict = true;
      }
      p_n_predicts = n_predicts;
    }
  }
}